

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinycthread.c
# Opt level: O3

int mtx_init(mtx_t *mtx,int type)

{
  int iVar1;
  pthread_mutexattr_t attr;
  pthread_mutexattr_t local_1c;
  
  pthread_mutexattr_init(&local_1c);
  if ((type & 8U) != 0) {
    pthread_mutexattr_settype(&local_1c,1);
  }
  iVar1 = pthread_mutex_init((pthread_mutex_t *)mtx,&local_1c);
  pthread_mutexattr_destroy(&local_1c);
  return (uint)(iVar1 == 0);
}

Assistant:

int mtx_init(mtx_t *mtx, int type)
{
#if defined(_TTHREAD_WIN32_)
  mtx->mAlreadyLocked = FALSE;
  mtx->mRecursive = type & mtx_recursive;
  InitializeCriticalSection(&mtx->mHandle);
  return thrd_success;
#else
  int ret;
  pthread_mutexattr_t attr;
  pthread_mutexattr_init(&attr);
  if (type & mtx_recursive)
  {
    pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
  }
  ret = pthread_mutex_init(mtx, &attr);
  pthread_mutexattr_destroy(&attr);
  return ret == 0 ? thrd_success : thrd_error;
#endif
}